

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void reachable_code_pass(TCGContext_conflict9 *s)

{
  char cVar1;
  TCGOp *pTVar2;
  TCGOp *op_00;
  bool bVar3;
  bool bVar4;
  TCGLabel *pTVar5;
  TCGLabel *pTVar6;
  TCGOp *op_prev;
  int call_flags;
  TCGLabel *label;
  _Bool remove;
  _Bool dead;
  TCGOp *op_next;
  TCGOp *op;
  TCGContext_conflict9 *s_local;
  
  bVar3 = false;
  pTVar2 = (s->ops).tqh_first;
  do {
    op_next = pTVar2;
    if (op_next == (TCGOp *)0x0) {
      return;
    }
    pTVar2 = (op_next->link).tqe_next;
    cVar1 = *(char *)op_next;
    if (cVar1 == '\x01') {
      pTVar5 = arg_label(op_next->args[0]);
      if (*(uint *)pTVar5 >> 0x10 == 0) {
        bVar4 = true;
      }
      else {
        bVar3 = false;
        bVar4 = false;
        if (((*(uint *)pTVar5 >> 0x10 == 1) &&
            (op_00 = (TCGOp *)((op_next->link).tqe_circ.tql_prev)->tql_prev->tql_next,
            ((undefined1  [120])*op_00 & (undefined1  [120])0xff) == (undefined1  [120])0x3)) &&
           (pTVar6 = arg_label(op_00->args[0]), pTVar5 == pTVar6)) {
          tcg_op_remove_tricore(s,op_00);
          bVar4 = true;
        }
      }
    }
    else {
      bVar4 = bVar3;
      if (cVar1 == '\x02') {
        if ((op_next->args
             [(int)((*(uint *)op_next >> 0xc & 0xf) + (*(uint *)op_next >> 8 & 0xf) + 1)] & 8) != 0)
        {
          bVar3 = true;
        }
      }
      else if (cVar1 == '\x03') {
LAB_012d61d6:
        bVar3 = true;
      }
      else if (cVar1 == -0x7f) {
        bVar4 = false;
      }
      else if ((cVar1 == -0x7e) || (cVar1 == -0x7c)) goto LAB_012d61d6;
    }
    if (bVar4) {
      tcg_op_remove_tricore(s,op_next);
    }
  } while( true );
}

Assistant:

static void reachable_code_pass(TCGContext *s)
{
    TCGOp *op, *op_next;
    bool dead = false;

    QTAILQ_FOREACH_SAFE(op, &s->ops, link, op_next) {
        bool remove = dead;
        TCGLabel *label;
        int call_flags;

        switch (op->opc) {
        case INDEX_op_set_label:
            label = arg_label(op->args[0]);
            if (label->refs == 0) {
                /*
                 * While there is an occasional backward branch, virtually
                 * all branches generated by the translators are forward.
                 * Which means that generally we will have already removed
                 * all references to the label that will be, and there is
                 * little to be gained by iterating.
                 */
                remove = true;
            } else {
                /* Once we see a label, insns become live again.  */
                dead = false;
                remove = false;

                /*
                 * Optimization can fold conditional branches to unconditional.
                 * If we find a label with one reference which is preceded by
                 * an unconditional branch to it, remove both.  This needed to
                 * wait until the dead code in between them was removed.
                 */
                if (label->refs == 1) {
                    TCGOp *op_prev = QTAILQ_PREV(op, link);
                    if (op_prev->opc == INDEX_op_br &&
                        label == arg_label(op_prev->args[0])) {
                        tcg_op_remove(s, op_prev);
                        remove = true;
                    }
                }
            }
            break;

        case INDEX_op_br:
        case INDEX_op_exit_tb:
        case INDEX_op_goto_ptr:
            /* Unconditional branches; everything following is dead.  */
            dead = true;
            break;

        case INDEX_op_call:
            /* Notice noreturn helper calls, raising exceptions.  */
            call_flags = op->args[TCGOP_CALLO(op) + TCGOP_CALLI(op) + 1];
            if (call_flags & TCG_CALL_NO_RETURN) {
                dead = true;
            }
            break;

        case INDEX_op_insn_start:
            /* Never remove -- we need to keep these for unwind.  */
            remove = false;
            break;

        default:
            break;
        }

        if (remove) {
            tcg_op_remove(s, op);
        }
    }
}